

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_aese_arm(void *vd,void *vm,uint32_t decrypt)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  CRYPTO_STATE st;
  CRYPTO_STATE rk;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  ulong local_8;
  
  local_10 = *vm;
  local_8 = *(ulong *)((long)vm + 8);
  local_20 = *vd;
  local_18 = *(ulong *)((long)vd + 8);
  if (decrypt < 2) {
    local_10 = local_20 ^ local_10;
    local_8 = local_18 ^ local_8;
    puVar1 = helper_crypto_aese_arm::sbox[decrypt];
    puVar2 = helper_crypto_aese_arm::shift[decrypt];
    lVar3 = 0;
    do {
      *(uint8_t *)((long)&local_20 + lVar3) =
           puVar1[*(byte *)((long)&local_10 + (ulong)puVar2[lVar3])];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    *(ulong *)vd = local_20;
    *(ulong *)((long)vd + 8) = local_18;
    return;
  }
  __assert_fail("decrypt < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                ,0x2a,"void helper_crypto_aese_arm(void *, void *, uint32_t)");
}

Assistant:

void HELPER(crypto_aese)(void *vd, void *vm, uint32_t decrypt)
{
    static uint8_t const * const sbox[2] = { AES_sbox, AES_isbox };
    static uint8_t const * const shift[2] = { AES_shifts, AES_ishifts };
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE rk = { .l = { rm[0], rm[1] } };
    union CRYPTO_STATE st = { .l = { rd[0], rd[1] } };
    int i;

    assert(decrypt < 2);

    /* xor state vector with round key */
    rk.l[0] ^= st.l[0];
    rk.l[1] ^= st.l[1];

    /* combine ShiftRows operation and sbox substitution */
    for (i = 0; i < 16; i++) {
        CR_ST_BYTE(st, i) = sbox[decrypt][CR_ST_BYTE(rk, shift[decrypt][i])];
    }

    rd[0] = st.l[0];
    rd[1] = st.l[1];
}